

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-writer2.h
# Opt level: O0

SparseVectorWriter<int,_double> __thiscall
mp::NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_>::
SingleSparseVecWrtFactory<int,_double>::MakeVectorWriter
          (SingleSparseVecWrtFactory<int,_double> *this,size_t nnz)

{
  bool bVar1;
  ulong in_RDX;
  size_t extraout_RDX;
  long *in_RSI;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *in_RDI;
  SparseVectorWriter<int,_double> SVar2;
  int in_stack_ffffffffffffffcc;
  NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *pNVar3;
  
  pNVar3 = in_RDI;
  if (in_RSI[1] == 0) {
    bVar1 = std::function::operator_cast_to_bool((function<void_(int)> *)0x10e015);
    if (bVar1) {
      std::function<void_(int)>::operator()
                ((function<void_(int)> *)pNVar3,in_stack_ffffffffffffffcc);
    }
  }
  else {
    TextFormatter::apr((TextFormatter *)*in_RSI,(File *)(*in_RSI + 0x138),(char *)in_RSI[1],
                       in_RDX & 0xffffffff);
  }
  SparseVectorWriter<int,_double>::SparseVectorWriter
            ((SparseVectorWriter<int,_double> *)pNVar3,
             (NLWriter2<mp::NLWriter2Params<mp::TextFormatter,_ExampleNLFeeder>_> *)*in_RSI,in_RDX);
  SVar2.n_entries_ = extraout_RDX;
  SVar2.p_nlw_ = in_RDI;
  return SVar2;
}

Assistant:

SparseVectorWriter<Index, Value> MakeVectorWriter(size_t nnz) {
      assert(0 == nInst_++);
      if (fmt_)
        nlw_.apr(nlw_.nm, fmt_, (int)nnz);
      else if (hdr_prn_)
        hdr_prn_(nnz);
      else {
        assert(0);
      }
      return {nlw_, nnz};
    }